

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# png.c
# Opt level: O1

png_fixed_point
png_muldiv_warn(png_const_structrp png_ptr,png_fixed_point a,png_int_32 times,png_int_32 divisor)

{
  int in_EAX;
  bool bVar1;
  double dVar2;
  
  if (divisor == 0) {
    bVar1 = true;
  }
  else {
    in_EAX = 0;
    bVar1 = false;
    if (times != 0 && a != 0) {
      dVar2 = floor(((double)times * (double)a) / (double)divisor + 0.5);
      in_EAX = (int)dVar2;
      bVar1 = 2147483647.0 < dVar2 || dVar2 < -2147483648.0;
    }
  }
  if (bVar1) {
    png_warning(png_ptr,"fixed point overflow ignored");
    in_EAX = 0;
  }
  return in_EAX;
}

Assistant:

png_fixed_point
png_muldiv_warn(png_const_structrp png_ptr, png_fixed_point a, png_int_32 times,
    png_int_32 divisor)
{
   png_fixed_point result;

   if (png_muldiv(&result, a, times, divisor) != 0)
      return result;

   png_warning(png_ptr, "fixed point overflow ignored");
   return 0;
}